

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O2

BigNumber * __thiscall BigNumber::operator-(BigNumber *__return_storage_ptr__,BigNumber *this)

{
  uint uVar1;
  int8_t *piVar2;
  int8_t *piVar3;
  size_t i;
  ulong uVar4;
  
  __return_storage_ptr__->numArray = (int8_t *)0x0;
  __return_storage_ptr__->sign = (bool)(this->sign ^ 1);
  uVar1 = this->numOfDigits;
  __return_storage_ptr__->numOfDigits = uVar1;
  piVar3 = (int8_t *)operator_new__((ulong)uVar1);
  __return_storage_ptr__->numArray = piVar3;
  piVar2 = this->numArray;
  for (uVar4 = 0; uVar4 < uVar1; uVar4 = uVar4 + 1) {
    piVar3[uVar4] = piVar2[uVar4];
  }
  return __return_storage_ptr__;
}

Assistant:

BigNumber BigNumber:: operator-() const{    //gharine kardan bigNumber
    BigNumber temp;
    temp.sign = !sign;
    temp.numOfDigits = numOfDigits;
    temp.numArray = new int8_t[numOfDigits];
    for( size_t i{0}; i < numOfDigits; ++i){
        temp.numArray[i] = numArray[i];
    }
    return temp;
}